

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

Div_Type_t Bmc_FxDivXor(int LitA,int LitB,int *pLits,int *pPhase)

{
  uint uVar1;
  int iVar2;
  int *pPhase_local;
  int *pLits_local;
  int LitB_local;
  int LitA_local;
  
  if (LitA != LitB) {
    uVar1 = Abc_LitIsCompl(LitA);
    *pPhase = uVar1 ^ *pPhase;
    uVar1 = Abc_LitIsCompl(LitB);
    *pPhase = uVar1 ^ *pPhase;
    iVar2 = Abc_LitRegular(LitA);
    *pLits = iVar2;
    iVar2 = Abc_LitRegular(LitB);
    pLits[1] = iVar2;
    return DIV_XOR;
  }
  __assert_fail("LitA != LitB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFx.c"
                ,0xbf,"Div_Type_t Bmc_FxDivXor(int, int, int *, int *)");
}

Assistant:

static inline Div_Type_t Bmc_FxDivXor( int LitA, int LitB, int * pLits, int * pPhase )
{
    assert( LitA != LitB );
    *pPhase ^= Abc_LitIsCompl(LitA);
    *pPhase ^= Abc_LitIsCompl(LitB);
    pLits[0] = Abc_LitRegular(LitA);
    pLits[1] = Abc_LitRegular(LitB);
    return DIV_XOR;
}